

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_28494c::CAPIExternalCommand::executeExternalCommand
          (CAPIExternalCommand *this,BuildSystem *system,TaskInterface ti,
          QueueJobContext *job_context,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn)

{
  code *pcVar1;
  _func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr_void_ptr__func_void_void_ptr_llb_buildsystem_command_result_t_llb_build_value_ptr_ptr
  *p_Var2;
  CancellationDelegate *pCVar3;
  _func_llb_build_value_ptr_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr
  *p_Var4;
  _func_llb_buildsystem_command_result_t_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr
  *p_Var5;
  llb_buildsystem_command_result_t result;
  undefined8 *puVar6;
  undefined8 *puVar7;
  CancellationDelegate *del;
  llb_build_value *plVar8;
  char *pcVar9;
  code *local_98;
  char local_90 [16];
  undefined1 local_80 [56];
  code *local_48;
  char acStack_40 [8];
  bool local_38;
  
  local_80._24_8_ = ti.ctx;
  local_80._16_8_ = ti.impl;
  local_38 = (completionFn->Storage).hasVal;
  local_80._0_8_ = this;
  local_80._8_8_ = system;
  local_80._32_8_ = job_context;
  if (local_38 == true) {
    local_48 = (code *)0x0;
    acStack_40[0] = '\0';
    acStack_40[1] = '\0';
    acStack_40[2] = '\0';
    acStack_40[3] = '\0';
    acStack_40[4] = '\0';
    acStack_40[5] = '\0';
    acStack_40[6] = '\0';
    acStack_40[7] = '\0';
    local_80[0x28] = '\0';
    local_80[0x29] = '\0';
    local_80[0x2a] = '\0';
    local_80[0x2b] = '\0';
    local_80[0x2c] = '\0';
    local_80[0x2d] = '\0';
    local_80[0x2e] = '\0';
    local_80[0x2f] = '\0';
    local_80[0x30] = '\0';
    local_80[0x31] = '\0';
    local_80[0x32] = '\0';
    local_80[0x33] = '\0';
    local_80[0x34] = '\0';
    local_80[0x35] = '\0';
    local_80[0x36] = '\0';
    local_80[0x37] = '\0';
    pcVar1 = *(code **)((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer +
                       0x10);
    if (pcVar1 == (code *)0x0) {
      local_98 = (code *)0x0;
      local_90[0] = '\0';
      local_90[1] = '\0';
      local_90[2] = '\0';
      local_90[3] = '\0';
      local_90[4] = '\0';
      local_90[5] = '\0';
      local_90[6] = '\0';
      local_90[7] = '\0';
    }
    else {
      (*pcVar1)(local_80 + 0x28,completionFn,2);
      local_90._0_8_ =
           *(undefined8 *)
            ((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x18);
      local_98 = *(code **)((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer
                           + 0x10);
      local_48 = local_98;
      acStack_40 = (char  [8])local_90._0_8_;
    }
  }
  p_Var2 = (this->cAPIDelegate).execute_command_detached;
  if (p_Var2 == (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr_void_ptr__func_void_void_ptr_llb_buildsystem_command_result_t_llb_build_value_ptr_ptr
                 *)0x0) {
    p_Var4 = (this->cAPIDelegate).execute_command_ex;
    if (p_Var4 != (_func_llb_build_value_ptr_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr
                   *)0x0) {
      plVar8 = (*p_Var4)((this->cAPIDelegate).context,(llb_buildsystem_command_t *)this,
                         (llb_buildsystem_interface_t *)system,(llb_task_interface_t)ti,
                         (llb_buildsystem_queue_job_context_t *)job_context);
      this->currentBuildValue = (CAPIBuildValue *)plVar8;
      if (*(int *)plVar8 != 0) {
        executeExternalCommand::anon_class_80_5_b6e7d4dc::operator()
                  ((anon_class_80_5_b6e7d4dc *)local_80,Succeeded);
        llbuild::basic::
        ScopeDefer<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp:1117:7)>
        ::~ScopeDefer((ScopeDefer<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_apple[P]swift_llbuild_products_libllbuild_BuildSystem_C_API_cpp:1117:7)>
                       *)this);
        goto LAB_0017f4c7;
      }
      llbuild::basic::
      ScopeDefer<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp:1117:7)>
      ::~ScopeDefer((ScopeDefer<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_apple[P]swift_llbuild_products_libllbuild_BuildSystem_C_API_cpp:1117:7)>
                     *)this);
    }
    p_Var5 = (this->cAPIDelegate).execute_command;
    if (p_Var5 == (_func_llb_buildsystem_command_result_t_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr
                   *)0x0) {
      __assert_fail("cAPIDelegate.execute_command != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                    ,0x46b,
                    "virtual void (anonymous namespace)::CAPIExternalCommand::executeExternalCommand(BuildSystem &, core::TaskInterface, QueueJobContext *, llvm::Optional<ProcessCompletionFn>)"
                   );
    }
    result = (*p_Var5)((this->cAPIDelegate).context,(llb_buildsystem_command_t *)this,
                       (llb_buildsystem_interface_t *)system,(llb_task_interface_t)ti,
                       (llb_buildsystem_queue_job_context_t *)job_context);
    executeExternalCommand::anon_class_80_5_b6e7d4dc::operator()
              ((anon_class_80_5_b6e7d4dc *)local_80,result);
  }
  else {
    puVar6 = (undefined8 *)operator_new(0x30);
    *puVar6 = this;
    puVar6[1] = system;
    puVar6[3] = 0;
    puVar7 = (undefined8 *)operator_new(0x50);
    *puVar7 = local_80._0_8_;
    puVar7[1] = local_80._8_8_;
    puVar7[2] = local_80._16_8_;
    puVar7[3] = local_80._24_8_;
    puVar7[4] = local_80._32_8_;
    *(bool *)(puVar7 + 9) = local_38;
    if (local_38 == true) {
      pcVar9 = (char *)(puVar7 + 5);
      pcVar9[0] = '\0';
      pcVar9[1] = '\0';
      pcVar9[2] = '\0';
      pcVar9[3] = '\0';
      pcVar9[4] = '\0';
      pcVar9[5] = '\0';
      pcVar9[6] = '\0';
      pcVar9[7] = '\0';
      puVar7[6] = 0;
      puVar7[7] = 0;
      puVar7[8] = local_90._0_8_;
      if (local_98 != (code *)0x0) {
        *(undefined8 *)pcVar9 = local_80._40_8_;
        puVar7[6] = local_80._48_8_;
        puVar7[7] = local_98;
        local_48 = (code *)0x0;
        acStack_40[0] = '\0';
        acStack_40[1] = '\0';
        acStack_40[2] = '\0';
        acStack_40[3] = '\0';
        acStack_40[4] = '\0';
        acStack_40[5] = '\0';
        acStack_40[6] = '\0';
        acStack_40[7] = '\0';
      }
    }
    puVar6[2] = puVar7;
    puVar6[5] = std::
                _Function_handler<void_(llbuild::basic::ProcessStatus),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp:1007:19)>
                ::_M_invoke;
    puVar6[4] = std::
                _Function_handler<void_(llbuild::basic::ProcessStatus),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp:1007:19)>
                ::_M_manager;
    (*p_Var2)((this->cAPIDelegate).context,(llb_buildsystem_command_t *)this,
              (llb_buildsystem_interface_t *)system,(llb_task_interface_t)ti,
              (llb_buildsystem_queue_job_context_t *)job_context,puVar6,
              executeExternalCommand::ResultCallbackContext::callback);
    if ((this->cAPIDelegate).cancel_detached_command !=
        (_func_void_void_ptr_llb_buildsystem_command_t_ptr *)0x0) {
      del = (CancellationDelegate *)operator_new(0x10);
      del->_vptr_CancellationDelegate = (_func_int **)&PTR__CancellationDelegate_0023b210;
      del[1]._vptr_CancellationDelegate = (_func_int **)this;
      pCVar3 = (this->cancellationDelegate)._M_t.
               super___uniq_ptr_impl<llbuild::core::CancellationDelegate,_std::default_delete<llbuild::core::CancellationDelegate>_>
               ._M_t.
               super__Tuple_impl<0UL,_llbuild::core::CancellationDelegate_*,_std::default_delete<llbuild::core::CancellationDelegate>_>
               .super__Head_base<0UL,_llbuild::core::CancellationDelegate_*,_false>._M_head_impl;
      (this->cancellationDelegate)._M_t.
      super___uniq_ptr_impl<llbuild::core::CancellationDelegate,_std::default_delete<llbuild::core::CancellationDelegate>_>
      ._M_t.
      super__Tuple_impl<0UL,_llbuild::core::CancellationDelegate_*,_std::default_delete<llbuild::core::CancellationDelegate>_>
      .super__Head_base<0UL,_llbuild::core::CancellationDelegate_*,_false>._M_head_impl = del;
      if (pCVar3 != (CancellationDelegate *)0x0) {
        (*pCVar3->_vptr_CancellationDelegate[1])();
        del = (this->cancellationDelegate)._M_t.
              super___uniq_ptr_impl<llbuild::core::CancellationDelegate,_std::default_delete<llbuild::core::CancellationDelegate>_>
              ._M_t.
              super__Tuple_impl<0UL,_llbuild::core::CancellationDelegate_*,_std::default_delete<llbuild::core::CancellationDelegate>_>
              .super__Head_base<0UL,_llbuild::core::CancellationDelegate_*,_false>._M_head_impl;
      }
      llbuild::buildsystem::BuildSystem::addCancellationDelegate(system,del);
    }
  }
LAB_0017f4c7:
  if ((local_38 == true) && (local_48 != (code *)0x0)) {
    (*local_48)(local_80 + 0x28,local_80 + 0x28,3);
  }
  return;
}

Assistant:

virtual void executeExternalCommand(BuildSystem& system,
                                      core::TaskInterface ti,
                                      QueueJobContext* job_context,
                                      llvm::Optional<ProcessCompletionFn> completionFn) override {
    auto doneFn = [this, &system, ti, job_context, completionFn](ProcessStatus result) mutable {
      if (result != ProcessStatus::Succeeded) {
        // If the command did not succeed, there is no need to gather dependencies.
        if (completionFn.hasValue())
          completionFn.getValue()(result);
        return;
      }

      // Otherwise, collect the discovered dependencies, if used.
      bool dependencyParsingResult = false;
      if (!depsPaths.empty()) {
        for (const auto& depsPath: depsPaths) {
          switch (depsFormat) {
            case llb_buildsystem_dependency_data_format_unused:
              ti.delegate()->error("No dependency format specified for discovered dependency files.");
              dependencyParsingResult = false;
              break;
            case llb_buildsystem_dependency_data_format_makefile:
              dependencyParsingResult = processMakefileDiscoveredDependencies(system, ti, job_context, depsPath, false);
              break;
            case llb_buildsystem_dependency_data_format_dependencyinfo:
              dependencyParsingResult = processDependencyInfoDiscoveredDependencies(system, ti, job_context, depsPath);
              break;
            case llb_buildsystem_dependency_data_format_makefile_ignoring_subsequent_outputs:
              dependencyParsingResult = processMakefileDiscoveredDependencies(system, ti, job_context, depsPath, true);
              break;
          }
          
          if (!dependencyParsingResult) {
            // If we were unable to process the dependencies output, report a
            // failure.
            if (completionFn.hasValue())
              completionFn.getValue()(ProcessStatus::Failed);
            return;
          }
        }
      }

      if (completionFn.hasValue())
        completionFn.getValue()(result);
    };

    if (cAPIDelegate.execute_command_detached) {
      struct ResultCallbackContext {
        CAPIExternalCommand *thisCommand;
        BuildSystem *buildSystem;
        std::function<void(ProcessStatus result)> doneFn;

        static void callback(void* result_ctx,
                             llb_buildsystem_command_result_t result,
                             llb_build_value* rvalue) {
          ResultCallbackContext *ctx = static_cast<ResultCallbackContext*>(result_ctx);
          auto thisCommand = ctx->thisCommand;
          BuildSystem &system = *ctx->buildSystem;
          auto doneFn = std::move(ctx->doneFn);
          delete ctx;

          thisCommand->detachedCommandFinished = true;
          if (auto cancellationDelegate = thisCommand->cancellationDelegate.get()) {
            system.removeCancellationDelegate(cancellationDelegate);
            thisCommand->cancellationDelegate = nullptr;
          }

          thisCommand->currentBuildValue = reinterpret_cast<CAPIBuildValue*>(rvalue);
          llbuild_defer {
            delete thisCommand->currentBuildValue;
            thisCommand->currentBuildValue = nullptr;
          };
          doneFn(getProcessStatusFromLLBResult(result));
        }
      };
      auto *callbackCtx = new ResultCallbackContext{this, &system, std::move(doneFn)};
      cAPIDelegate.execute_command_detached(
        cAPIDelegate.context,
        (llb_buildsystem_command_t*)this,
        (llb_buildsystem_interface_t*)&system,
        *reinterpret_cast<llb_task_interface_t*>(&ti),
        (llb_buildsystem_queue_job_context_t*)job_context,
        callbackCtx, ResultCallbackContext::callback);

      if (cAPIDelegate.cancel_detached_command) {
        class CAPICancellationDelegate: public core::CancellationDelegate {
          CAPIExternalCommand *thisCommand;

        public:
          CAPICancellationDelegate(CAPIExternalCommand *thisCommand) : thisCommand(thisCommand) {}

          void buildCancelled() override {
            if (thisCommand->detachedCommandFinished)
              return;
            thisCommand->cAPIDelegate.cancel_detached_command(
              thisCommand->cAPIDelegate.context,
              (llb_buildsystem_command_t*)this);
          }
        };
        this->cancellationDelegate = std::make_unique<CAPICancellationDelegate>(this);
        system.addCancellationDelegate(this->cancellationDelegate.get());
      }
      return;
    }

    if (cAPIDelegate.execute_command_ex) {
      llb_build_value* rvalue = cAPIDelegate.execute_command_ex(
        cAPIDelegate.context,
        (llb_buildsystem_command_t*)this,
        (llb_buildsystem_interface_t*)&system,
        *reinterpret_cast<llb_task_interface_t*>(&ti),
        (llb_buildsystem_queue_job_context_t*)job_context);

      currentBuildValue = reinterpret_cast<CAPIBuildValue*>(rvalue);
      llbuild_defer {
        delete currentBuildValue;
        currentBuildValue = nullptr;
      };

      if (!currentBuildValue->getInternalBuildValue().isInvalid()) {
        doneFn(ProcessStatus::Succeeded);
        return;
      }

      // An invalid value is interpreted as an unsupported method call and falls
      // through to execute_command below.
    }